

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall
GEO::Delaunay3dThread::show_tet_adjacent(Delaunay3dThread *this,index_t t,index_t lf)

{
  uint uVar1;
  undefined8 in_RAX;
  undefined1 uVar2;
  undefined8 uStack_18;
  
  uVar1 = (this->cell_to_cell_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
          super__Vector_impl_data._M_start[lf + t * 4];
  uStack_18 = in_RAX;
  if ((ulong)uVar1 != 0xffffffff) {
    uVar2 = 0x2a;
    if ((this->cell_next_->
        super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1] == 0xfffffffe) {
      uVar2 = 0x20;
    }
    uStack_18._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
    uStack_18._0_7_ = CONCAT16(uVar2,(int6)in_RAX);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)((long)&uStack_18 + 6),1);
  }
  std::ostream::operator<<(&std::cerr,uVar1);
  uStack_18 = CONCAT17(0x20,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void show_tet_adjacent(index_t t, index_t lf) const {
            signed_index_t adj = tet_adjacent(t, lf);
            if(adj != -1) {
                std::cerr << (tet_is_in_list(index_t(adj)) ? '*' : ' ');
            }
            std::cerr << adj;
            std::cerr << ' ';
        }